

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O3

char * __thiscall
google::protobuf::internal::UnknownFieldLiteParserHelper::ParseGroup
          (UnknownFieldLiteParserHelper *this,uint32 num,char *ptr,ParseContext *ctx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  uint32 uVar4;
  bool bVar5;
  char *pcVar6;
  char *pcVar7;
  uint uVar8;
  ulong uVar9;
  char cVar10;
  
  uVar8 = num << 3;
  if (this->unknown_ != (string *)0x0) {
    uVar9 = (ulong)(uVar8 | 3);
    cVar10 = (char)this->unknown_;
    if (0x7f < uVar8) {
      do {
        std::__cxx11::string::push_back(cVar10);
        bVar5 = 0x3fff < uVar9;
        uVar9 = uVar9 >> 7;
      } while (bVar5);
    }
    std::__cxx11::string::push_back(cVar10);
  }
  iVar3 = ctx->depth_;
  ctx->depth_ = iVar3 + -1;
  if (iVar3 < 1) {
    pcVar7 = (char *)0x0;
  }
  else {
    ctx->group_depth_ = ctx->group_depth_ + 1;
    pcVar6 = WireFormatParser<google::protobuf::internal::UnknownFieldLiteParserHelper>
                       (this,ptr,ctx);
    uVar1 = ctx->depth_;
    uVar2 = ctx->group_depth_;
    ctx->depth_ = uVar1 + 1;
    ctx->group_depth_ = uVar2 + -1;
    uVar4 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
    pcVar7 = (char *)0x0;
    if (((pcVar6 != (char *)0x0) && (uVar4 == (uVar8 | 3))) &&
       (pcVar7 = pcVar6, this->unknown_ != (string *)0x0)) {
      uVar9 = (ulong)(uVar8 | 4);
      cVar10 = (char)this->unknown_;
      if (0x7f < uVar8) {
        do {
          std::__cxx11::string::push_back(cVar10);
          bVar5 = 0x3fff < uVar9;
          uVar9 = uVar9 >> 7;
        } while (bVar5);
      }
      std::__cxx11::string::push_back(cVar10);
    }
  }
  return pcVar7;
}

Assistant:

const char* ParseGroup(uint32 num, const char* ptr, ParseContext* ctx) {
    if (unknown_) WriteVarint(num * 8 + 3, unknown_);
    ptr = ctx->ParseGroup(this, ptr, num * 8 + 3);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    if (unknown_) WriteVarint(num * 8 + 4, unknown_);
    return ptr;
  }